

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Matchers::Exception::ExceptionMessageMatcher::ExceptionMessageMatcher
          (ExceptionMessageMatcher *this,string *message)

{
  pointer pcVar1;
  
  (this->super_MatcherBase<std::exception>).super_MatcherUntypedBase.m_cachedToString._M_dataplus.
  _M_p = (pointer)&(this->super_MatcherBase<std::exception>).super_MatcherUntypedBase.
                   m_cachedToString.field_2;
  (this->super_MatcherBase<std::exception>).super_MatcherUntypedBase.m_cachedToString.
  _M_string_length = 0;
  (this->super_MatcherBase<std::exception>).super_MatcherUntypedBase.m_cachedToString.field_2.
  _M_local_buf[0] = '\0';
  (this->super_MatcherBase<std::exception>).super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__ExceptionMessageMatcher_0019d980;
  (this->super_MatcherBase<std::exception>).super_MatcherMethod<std::exception>._vptr_MatcherMethod
       = (_func_int **)&DAT_0019d9b0;
  (this->m_message)._M_dataplus._M_p = (pointer)&(this->m_message).field_2;
  pcVar1 = (message->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_message,pcVar1,pcVar1 + message->_M_string_length);
  return;
}

Assistant:

ExceptionMessageMatcher(std::string const& message):
        m_message(message)
    {}